

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall
Jupiter::IRC::Client::addNamesToChannel(Client *this,Channel *in_channel,string_view in_names)

{
  bool bVar1;
  reference pbVar2;
  element_type *this_00;
  string *this_01;
  const_reference pvVar3;
  string_view in_name;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  __sv_type in_nickname;
  shared_ptr<Jupiter::IRC::Client::User> local_d8;
  undefined1 local_c8 [40];
  char *local_a0;
  undefined1 local_98 [8];
  shared_ptr<Jupiter::IRC::Client::User> user;
  undefined1 local_78 [8];
  basic_string_view<char,_std::char_traits<char>_> name;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range1;
  undefined1 local_48 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  names;
  size_t offset;
  Channel *in_channel_local;
  Client *this_local;
  string_view in_names_local;
  
  in_names_local._M_len = (size_t)in_names._M_str;
  this_local = (Client *)in_names._M_len;
  __range1._7_1_ = 0x20;
  jessilib::split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_char>
            ((container_type *)local_48,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (char *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_48);
  name._M_str = (char *)std::
                        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      (&__end1,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                *)&name._M_str);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end1);
    local_78 = (undefined1  [8])pbVar2->_M_len;
    name._M_len = (size_t)pbVar2->_M_str;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_78);
    if (!bVar1) {
      join_0x00000010_0x00000000_ =
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_prefixes);
      names.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                               join_0x00000010_0x00000000_,0);
      if (names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0xffffffffffffffff) {
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                           (size_type)
                           names.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0xffffffffffffffff);
        in_name._M_str = (char *)bVar4._M_len;
        in_name._M_len = (size_t)this;
        unique0x10000379 = bVar4;
        findUserOrAdd((Client *)local_98,in_name);
        std::shared_ptr<Jupiter::IRC::Client::User>::shared_ptr
                  (&local_d8,(shared_ptr<Jupiter::IRC::Client::User> *)local_98);
        Channel::addUser((Channel *)local_c8,(shared_ptr<Jupiter::IRC::Client::User> *)in_channel);
        std::shared_ptr<Jupiter::IRC::Client::Channel::User>::~shared_ptr
                  ((shared_ptr<Jupiter::IRC::Client::Channel::User> *)local_c8);
        std::shared_ptr<Jupiter::IRC::Client::User>::~shared_ptr(&local_d8);
        while (names.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          names.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&names.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage[-1]._M_str + 7);
          this_00 = std::
                    __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_98);
          this_01 = User::getNickname_abi_cxx11_(this_00);
          in_nickname = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                              (size_type)
                              names.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Channel::addUserPrefix(in_channel,in_nickname,*pvVar3);
        }
        std::shared_ptr<Jupiter::IRC::Client::User>::~shared_ptr
                  ((shared_ptr<Jupiter::IRC::Client::User> *)local_98);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_48);
  return;
}

Assistant:

void Jupiter::IRC::Client::addNamesToChannel(Channel &in_channel, std::string_view in_names) {
	size_t offset;
	std::vector<std::string_view> names = jessilib::split_view(in_names, ' ');
	for (auto name : names) {
		if (name.empty()) {
			// Good candidate for a warning log
			continue;
		}

		offset = name.find_first_not_of(m_prefixes);
		if (offset == std::string_view::npos) {
			// The user's name is nothing but prefixes!? Good candidate for an error log
			continue;
		}

		// Add the user
		auto user = Client::findUserOrAdd(name.substr(offset));
		in_channel.addUser(user);

		// Add any prefixes we received to the user
		while (offset > 0) {
			--offset;
			in_channel.addUserPrefix(user->getNickname(), name[offset]);
		}
	}
}